

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conveyer.cpp
# Opt level: O0

void Conveyer::printBinary(int numInTen)

{
  int local_10;
  int i;
  int numInTen_local;
  
  for (local_10 = 0xb; -1 < local_10; local_10 = local_10 + -1) {
    if ((numInTen & 1 << ((byte)local_10 & 0x1f)) == 0) {
      std::operator<<((ostream *)&std::cout,"0");
    }
    else {
      std::operator<<((ostream *)&std::cout,"1");
    }
    if (local_10 % 4 == 0) {
      std::operator<<((ostream *)&std::cout,"-");
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Conveyer::printBinary(int numInTen) {
    for (int i = MAX_RESULT_DIGIT_INDEX; i >= 0; i--) {
        if (numInTen & (1 << i)) {
            cout << "1";
        } else cout << "0";
        if (i % 4 == 0)cout << "-";
    }
    cout << endl;
}